

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O2

void __thiscall
timertt::details::
basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::manager>
::
activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::manager>
           *this,duration<long,_std::ratio<1L,_1000000000L>_> pause,
          duration<long,_std::ratio<1L,_1000000000L>_> period,timer_action *action)

{
  _Manager_type p_Var1;
  undefined8 local_48;
  undefined8 uStack_40;
  _Manager_type local_38;
  undefined8 local_30;
  
  timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ::allocate((timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
              *)&stack0xffffffffffffffb0);
  local_38 = (_Manager_type)0x0;
  local_48 = 0;
  uStack_40 = (_Manager_type)0x0;
  local_30 = action->_M_invoker;
  p_Var1 = (action->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_48 = *(undefined8 *)&(action->super__Function_base)._M_functor;
    uStack_40 = *(undefined8 *)((long)&(action->super__Function_base)._M_functor + 8);
    (action->super__Function_base)._M_manager = (_Manager_type)0x0;
    action->_M_invoker = (_Invoker_type)0x0;
    local_38 = p_Var1;
  }
  activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (this,(timer_holder *)&stack0xffffffffffffffb0,pause,period,
             (timer_action *)&stack0xffffffffffffffb8);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffffb8);
  timer_object_holder<timertt::thread_safety::unsafe>::dismiss_object
            ((timer_object_holder<timertt::thread_safety::unsafe> *)&stack0xffffffffffffffb0);
  return;
}

Assistant:

void
	activate(
		//! Pause for timer execution.
		DURATION_1 pause,
		//! Repetition period.
		//! If <tt>DURATION_2::zero() == period</tt> then timer will be
		//! single-shot.
		DURATION_2 period,
		//! Action for the timer.
		timer_action action )
	{
		activate( allocate(), pause, period, std::move( action ) );
	}